

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void libserver::multiple_client_handler(void)

{
  _Iter_pred<boost::_bi::bind_t<bool,_boost::_mfi::cmf0<bool,_libserver::server>,_boost::_bi::list1<boost::arg<1>_>_>_>
  __pred;
  pointer psVar1;
  type this;
  __normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
  __first;
  pointer psVar2;
  shared_ptr<libserver::server> b;
  scoped_lock lk;
  shared_ptr<libserver::server> local_58;
  undefined8 local_48;
  unique_lock<boost::recursive_mutex> local_40;
  
  do {
    local_58.px = (element_type *)0x3e8;
    boost::this_thread::
    sleep<boost::date_time::subsecond_duration<boost::posix_time::time_duration,1000l>>
              ((subsecond_duration<boost::posix_time::time_duration,_1000L> *)&local_58);
    psVar1 = server_shared_ptrs.
             super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar2 = server_shared_ptrs.
                  super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1)
    {
      local_58.px = psVar2->px;
      local_58.pn.pi_ = (psVar2->pn).pi_;
      if (local_58.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_58.pn.pi_)->use_count_ = (local_58.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      this = boost::shared_ptr<libserver::server>::operator->(&local_58);
      server::handle_client(this);
      boost::detail::shared_count::~shared_count(&local_58.pn);
    }
    boost::unique_lock<boost::recursive_mutex>::unique_lock(&local_40,&cs);
    local_58.px = (element_type *)server::_is_timed_out;
    local_58.pn.pi_ = (sp_counted_base *)0x0;
    __pred._M_pred._16_8_ = local_48;
    __pred._M_pred.f_ = (cmf0<bool,_boost::shared_mutex::state_data>)ZEXT816(0x10da7a);
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<boost::shared_ptr<libserver::server>*,std::vector<boost::shared_ptr<libserver::server>,std::allocator<boost::shared_ptr<libserver::server>>>>,__gnu_cxx::__ops::_Iter_pred<boost::_bi::bind_t<bool,boost::_mfi::cmf0<bool,libserver::server>,boost::_bi::list1<boost::arg<1>>>>>
                        ((__normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
                          )server_shared_ptrs.
                           super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<boost::shared_ptr<libserver::server>_*,_std::vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>_>
                          )server_shared_ptrs.
                           super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__pred);
    std::
    vector<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
    ::erase(&server_shared_ptrs,(const_iterator)__first._M_current,
            (const_iterator)
            server_shared_ptrs.
            super__Vector_base<boost::shared_ptr<libserver::server>,_std::allocator<boost::shared_ptr<libserver::server>_>_>
            ._M_impl.super__Vector_impl_data._M_finish);
    boost::unique_lock<boost::recursive_mutex>::~unique_lock(&local_40);
  } while( true );
}

Assistant:

void libserver::multiple_client_handler()
{
    while ( true) {
        boost::this_thread::sleep( boost::posix_time::millisec(1));
        for (auto b:server_shared_ptrs) 
            (b)->handle_client();
        // erase clients that timed out
        boost::recursive_mutex::scoped_lock lk(cs);
        server_shared_ptrs.erase(std::remove_if(server_shared_ptrs.begin(), server_shared_ptrs.end(), 
                   boost::bind(&libserver::server::_is_timed_out,boost::placeholders::_1)), server_shared_ptrs.end());
    }
}